

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

void PVIP_node_push_child(PVIPNode *node,PVIPNode *child)

{
  int iVar1;
  _PVIPNode **pp_Var2;
  
  if (child == (PVIPNode *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0x111,"void PVIP_node_push_child(PVIPNode *, PVIPNode *)");
  }
  pp_Var2 = (_PVIPNode **)
            realloc((node->field_2).children.nodes,(long)(node->field_2).children.size * 8 + 8);
  (node->field_2).children.nodes = pp_Var2;
  if (pp_Var2 != (_PVIPNode **)0x0) {
    iVar1 = (node->field_2).children.size;
    pp_Var2[iVar1] = child;
    (node->field_2).children.size = iVar1 + 1;
    return;
  }
  __assert_fail("node->children.nodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0x114,"void PVIP_node_push_child(PVIPNode *, PVIPNode *)");
}

Assistant:

void PVIP_node_push_child(PVIPNode* node, PVIPNode* child) {
    assert(child);

    node->children.nodes = (PVIPNode**)realloc(node->children.nodes, sizeof(PVIPNode*)*(node->children.size+1));
    assert(node->children.nodes);
    node->children.nodes[node->children.size] = child;
    node->children.size++;
}